

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.h
# Opt level: O0

void __thiscall
flow::TerminateInstr::TerminateInstr
          (TerminateInstr *this,vector<flow::Value_*,_std::allocator<flow::Value_*>_> *ops)

{
  allocator<char> local_39;
  string local_38;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> *local_18;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> *ops_local;
  TerminateInstr *this_local;
  
  local_18 = ops;
  ops_local = (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  Instr::Instr(&this->super_Instr,Void,ops,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_Instr).super_Value._vptr_Value = (_func_int **)&PTR__TerminateInstr_002d36d8;
  return;
}

Assistant:

TerminateInstr(const std::vector<Value*>& ops)
      : Instr(LiteralType::Void, ops, "") {}